

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_values.cc
# Opt level: O1

bool __thiscall bssl::der::ParseVisibleString(der *this,Input in,string *out)

{
  der *pdVar1;
  uchar *puVar2;
  bool bVar3;
  
  bVar3 = in.data_.data_ == (uchar *)0x0;
  if (!bVar3) {
    if ((byte)((char)*this - 0x20U) < 0x5f) {
      puVar2 = (uchar *)0x1;
      do {
        bVar3 = in.data_.data_ == puVar2;
        if (bVar3) goto LAB_004b4ab4;
        pdVar1 = this + (long)puVar2;
        puVar2 = puVar2 + 1;
      } while ((byte)((char)*pdVar1 - 0x20U) < 0x5f);
    }
    if (bVar3 == false) {
      return false;
    }
  }
LAB_004b4ab4:
  ::std::__cxx11::string::_M_replace(in.data_.size_,0,*(char **)(in.data_.size_ + 8),(ulong)this);
  return bVar3;
}

Assistant:

bool ParseVisibleString(Input in, std::string *out) {
  // ITU-T X.680:
  // VisibleString : "Defining registration number 6" + SPACE
  // 6 includes all the characters from '!' .. '~' (33 .. 126), space is 32.
  // Also ITU-T X.691 says it much more clearly:
  // "for VisibleString [the range] is 32 to 126 ... For VisibleString .. all
  // the values in the range are present."
  for (uint8_t c : in) {
    if (c < 32 || c > 126) {
      return false;
    }
  }
  *out = BytesAsStringView(in);
  return true;
}